

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

char * decode_decimal(char *str,unsigned_long *v)

{
  long lVar1;
  ulong uVar2;
  char *orig;
  ulong uVar4;
  char cVar5;
  ulong uVar3;
  
  lVar1 = 0;
  uVar2 = 0;
  while( true ) {
    cVar5 = '\x02';
    if ((0xf5 < (byte)(str[lVar1] - 0x3aU)) && (cVar5 = '\x01', uVar2 < 0x199999999999999a)) {
      uVar4 = (ulong)(byte)(str[lVar1] - 0x30);
      cVar5 = CARRY8(uVar2 * 10,uVar4);
      uVar3 = 0;
      if (!(bool)cVar5) {
        uVar3 = uVar4;
      }
      uVar2 = uVar3 + uVar2 * 10;
    }
    if (cVar5 != '\0') break;
    lVar1 = lVar1 + 1;
  }
  if (((cVar5 == '\x02') && (lVar1 != 0)) && ((lVar1 == 1 || (*str != '0')))) {
    *v = uVar2;
    return str + lVar1;
  }
  return (char *)0x0;
}

Assistant:

static const char *decode_decimal(const char *str, unsigned long *v) {
    const char *orig;
    unsigned long acc;

    acc = 0;
    for (orig = str;; str++) {
        int c;

        c = *str;
        if (c < '0' || c > '9') {
            break;
        }
        c -= '0';
        if (acc > (ULONG_MAX / 10)) {
            return NULL;
        }
        acc *= 10;
        if ((unsigned long)c > (ULONG_MAX - acc)) {
            return NULL;
        }
        acc += (unsigned long)c;
    }
    if (str == orig || (*orig == '0' && str != (orig + 1))) {
        return NULL;
    }
    *v = acc;
    return str;
}